

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack4.h
# Opt level: O0

void ncnn::convdw5x5s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined8 *puVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _k44;
  __m128 _k43;
  __m128 _k42;
  __m128 _k41;
  __m128 _k40;
  __m128 _r44;
  __m128 _r43;
  __m128 _r42;
  __m128 _r41;
  __m128 _r40;
  __m128 _k34;
  __m128 _k33;
  __m128 _k32;
  __m128 _k31;
  __m128 _k30;
  __m128 _r34;
  __m128 _r33;
  __m128 _r32;
  __m128 _r31;
  __m128 _r30;
  __m128 _k24;
  __m128 _k23;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _r24;
  __m128 _r23;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _k14;
  __m128 _k13;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _r14;
  __m128 _r13;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _k04;
  __m128 _k03;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  __m128 _r04;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  int local_e50;
  int local_e4c;
  undefined8 *local_e48;
  undefined8 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_dd8;
  int local_d5c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  lVar6 = in_RDI[7];
  iVar7 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 4;
  lVar3 = *in_RCX;
  for (local_d5c = 0; local_d5c < (int)lVar6; local_d5c = local_d5c + 1) {
    local_dd8 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_d5c * in_RSI[2]);
    if (lVar3 == 0) {
      local_11c8 = 0;
      uStack_11c0 = 0;
    }
    else {
      puVar8 = (undefined8 *)(lVar3 + (long)(local_d5c << 2) * 4);
      local_11c8 = *puVar8;
      uStack_11c0 = puVar8[1];
    }
    puVar8 = (undefined8 *)
             (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_d5c * in_RDX[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    local_e28 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_d5c * in_RDI[2]);
    lVar4 = in_RDI[2];
    local_e30 = (undefined8 *)((long)local_e28 + iVar2 * lVar4);
    local_e38 = (undefined8 *)((long)local_e28 + (long)iVar2 * 2 * lVar4);
    local_e40 = (undefined8 *)((long)local_e28 + (long)iVar2 * 3 * lVar4);
    local_e48 = (undefined8 *)((long)local_e28 + (long)iVar2 * 4 * lVar4);
    for (local_e4c = 0; local_e4c < (int)lVar5; local_e4c = local_e4c + 1) {
      for (local_e50 = 0; local_e50 < iVar1; local_e50 = local_e50 + 1) {
        local_28 = (float)*puVar8;
        fStack_24 = (float)((ulong)*puVar8 >> 0x20);
        fStack_20 = (float)puVar8[1];
        fStack_1c = (float)((ulong)puVar8[1] >> 0x20);
        local_38 = (float)*local_e28;
        fStack_34 = (float)((ulong)*local_e28 >> 0x20);
        fStack_30 = (float)local_e28[1];
        fStack_2c = (float)((ulong)local_e28[1] >> 0x20);
        local_58 = (float)local_11c8;
        fStack_54 = (float)((ulong)local_11c8 >> 0x20);
        fStack_50 = (float)uStack_11c0;
        fStack_4c = (float)((ulong)uStack_11c0 >> 0x20);
        local_88 = (float)puVar8[2];
        fStack_84 = (float)((ulong)puVar8[2] >> 0x20);
        fStack_80 = (float)puVar8[3];
        fStack_7c = (float)((ulong)puVar8[3] >> 0x20);
        local_98 = (float)local_e28[2];
        fStack_94 = (float)((ulong)local_e28[2] >> 0x20);
        fStack_90 = (float)local_e28[3];
        fStack_8c = (float)((ulong)local_e28[3] >> 0x20);
        local_e8 = (float)puVar8[4];
        fStack_e4 = (float)((ulong)puVar8[4] >> 0x20);
        fStack_e0 = (float)puVar8[5];
        fStack_dc = (float)((ulong)puVar8[5] >> 0x20);
        local_f8 = (float)local_e28[4];
        fStack_f4 = (float)((ulong)local_e28[4] >> 0x20);
        fStack_f0 = (float)local_e28[5];
        fStack_ec = (float)((ulong)local_e28[5] >> 0x20);
        local_148 = (float)puVar8[6];
        fStack_144 = (float)((ulong)puVar8[6] >> 0x20);
        fStack_140 = (float)puVar8[7];
        fStack_13c = (float)((ulong)puVar8[7] >> 0x20);
        local_158 = (float)local_e28[6];
        fStack_154 = (float)((ulong)local_e28[6] >> 0x20);
        fStack_150 = (float)local_e28[7];
        fStack_14c = (float)((ulong)local_e28[7] >> 0x20);
        local_1a8 = (float)puVar8[8];
        fStack_1a4 = (float)((ulong)puVar8[8] >> 0x20);
        fStack_1a0 = (float)puVar8[9];
        fStack_19c = (float)((ulong)puVar8[9] >> 0x20);
        local_1b8 = (float)local_e28[8];
        fStack_1b4 = (float)((ulong)local_e28[8] >> 0x20);
        fStack_1b0 = (float)local_e28[9];
        fStack_1ac = (float)((ulong)local_e28[9] >> 0x20);
        local_208 = (float)puVar8[10];
        fStack_204 = (float)((ulong)puVar8[10] >> 0x20);
        fStack_200 = (float)puVar8[0xb];
        fStack_1fc = (float)((ulong)puVar8[0xb] >> 0x20);
        local_218 = (float)*local_e30;
        fStack_214 = (float)((ulong)*local_e30 >> 0x20);
        fStack_210 = (float)local_e30[1];
        fStack_20c = (float)((ulong)local_e30[1] >> 0x20);
        local_268 = (float)puVar8[0xc];
        fStack_264 = (float)((ulong)puVar8[0xc] >> 0x20);
        fStack_260 = (float)puVar8[0xd];
        fStack_25c = (float)((ulong)puVar8[0xd] >> 0x20);
        local_278 = (float)local_e30[2];
        fStack_274 = (float)((ulong)local_e30[2] >> 0x20);
        fStack_270 = (float)local_e30[3];
        fStack_26c = (float)((ulong)local_e30[3] >> 0x20);
        local_2c8 = (float)puVar8[0xe];
        fStack_2c4 = (float)((ulong)puVar8[0xe] >> 0x20);
        fStack_2c0 = (float)puVar8[0xf];
        fStack_2bc = (float)((ulong)puVar8[0xf] >> 0x20);
        local_2d8 = (float)local_e30[4];
        fStack_2d4 = (float)((ulong)local_e30[4] >> 0x20);
        fStack_2d0 = (float)local_e30[5];
        fStack_2cc = (float)((ulong)local_e30[5] >> 0x20);
        local_328 = (float)puVar8[0x10];
        fStack_324 = (float)((ulong)puVar8[0x10] >> 0x20);
        fStack_320 = (float)puVar8[0x11];
        fStack_31c = (float)((ulong)puVar8[0x11] >> 0x20);
        local_338 = (float)local_e30[6];
        fStack_334 = (float)((ulong)local_e30[6] >> 0x20);
        fStack_330 = (float)local_e30[7];
        fStack_32c = (float)((ulong)local_e30[7] >> 0x20);
        local_388 = (float)puVar8[0x12];
        fStack_384 = (float)((ulong)puVar8[0x12] >> 0x20);
        fStack_380 = (float)puVar8[0x13];
        fStack_37c = (float)((ulong)puVar8[0x13] >> 0x20);
        local_398 = (float)local_e30[8];
        fStack_394 = (float)((ulong)local_e30[8] >> 0x20);
        fStack_390 = (float)local_e30[9];
        fStack_38c = (float)((ulong)local_e30[9] >> 0x20);
        local_3e8 = (float)puVar8[0x14];
        fStack_3e4 = (float)((ulong)puVar8[0x14] >> 0x20);
        fStack_3e0 = (float)puVar8[0x15];
        fStack_3dc = (float)((ulong)puVar8[0x15] >> 0x20);
        local_3f8 = (float)*local_e38;
        fStack_3f4 = (float)((ulong)*local_e38 >> 0x20);
        fStack_3f0 = (float)local_e38[1];
        fStack_3ec = (float)((ulong)local_e38[1] >> 0x20);
        local_448 = (float)puVar8[0x16];
        fStack_444 = (float)((ulong)puVar8[0x16] >> 0x20);
        fStack_440 = (float)puVar8[0x17];
        fStack_43c = (float)((ulong)puVar8[0x17] >> 0x20);
        local_458 = (float)local_e38[2];
        fStack_454 = (float)((ulong)local_e38[2] >> 0x20);
        fStack_450 = (float)local_e38[3];
        fStack_44c = (float)((ulong)local_e38[3] >> 0x20);
        local_4a8 = (float)puVar8[0x18];
        fStack_4a4 = (float)((ulong)puVar8[0x18] >> 0x20);
        fStack_4a0 = (float)puVar8[0x19];
        fStack_49c = (float)((ulong)puVar8[0x19] >> 0x20);
        local_4b8 = (float)local_e38[4];
        fStack_4b4 = (float)((ulong)local_e38[4] >> 0x20);
        fStack_4b0 = (float)local_e38[5];
        fStack_4ac = (float)((ulong)local_e38[5] >> 0x20);
        local_508 = (float)puVar8[0x1a];
        fStack_504 = (float)((ulong)puVar8[0x1a] >> 0x20);
        fStack_500 = (float)puVar8[0x1b];
        fStack_4fc = (float)((ulong)puVar8[0x1b] >> 0x20);
        local_518 = (float)local_e38[6];
        fStack_514 = (float)((ulong)local_e38[6] >> 0x20);
        fStack_510 = (float)local_e38[7];
        fStack_50c = (float)((ulong)local_e38[7] >> 0x20);
        local_568 = (float)puVar8[0x1c];
        fStack_564 = (float)((ulong)puVar8[0x1c] >> 0x20);
        fStack_560 = (float)puVar8[0x1d];
        fStack_55c = (float)((ulong)puVar8[0x1d] >> 0x20);
        local_578 = (float)local_e38[8];
        fStack_574 = (float)((ulong)local_e38[8] >> 0x20);
        fStack_570 = (float)local_e38[9];
        fStack_56c = (float)((ulong)local_e38[9] >> 0x20);
        local_5c8 = (float)puVar8[0x1e];
        fStack_5c4 = (float)((ulong)puVar8[0x1e] >> 0x20);
        fStack_5c0 = (float)puVar8[0x1f];
        fStack_5bc = (float)((ulong)puVar8[0x1f] >> 0x20);
        local_5d8 = (float)*local_e40;
        fStack_5d4 = (float)((ulong)*local_e40 >> 0x20);
        fStack_5d0 = (float)local_e40[1];
        fStack_5cc = (float)((ulong)local_e40[1] >> 0x20);
        local_628 = (float)puVar8[0x20];
        fStack_624 = (float)((ulong)puVar8[0x20] >> 0x20);
        fStack_620 = (float)puVar8[0x21];
        fStack_61c = (float)((ulong)puVar8[0x21] >> 0x20);
        local_638 = (float)local_e40[2];
        fStack_634 = (float)((ulong)local_e40[2] >> 0x20);
        fStack_630 = (float)local_e40[3];
        fStack_62c = (float)((ulong)local_e40[3] >> 0x20);
        local_688 = (float)puVar8[0x22];
        fStack_684 = (float)((ulong)puVar8[0x22] >> 0x20);
        fStack_680 = (float)puVar8[0x23];
        fStack_67c = (float)((ulong)puVar8[0x23] >> 0x20);
        local_698 = (float)local_e40[4];
        fStack_694 = (float)((ulong)local_e40[4] >> 0x20);
        fStack_690 = (float)local_e40[5];
        fStack_68c = (float)((ulong)local_e40[5] >> 0x20);
        local_6e8 = (float)puVar8[0x24];
        fStack_6e4 = (float)((ulong)puVar8[0x24] >> 0x20);
        fStack_6e0 = (float)puVar8[0x25];
        fStack_6dc = (float)((ulong)puVar8[0x25] >> 0x20);
        local_6f8 = (float)local_e40[6];
        fStack_6f4 = (float)((ulong)local_e40[6] >> 0x20);
        fStack_6f0 = (float)local_e40[7];
        fStack_6ec = (float)((ulong)local_e40[7] >> 0x20);
        local_748 = (float)puVar8[0x26];
        fStack_744 = (float)((ulong)puVar8[0x26] >> 0x20);
        fStack_740 = (float)puVar8[0x27];
        fStack_73c = (float)((ulong)puVar8[0x27] >> 0x20);
        local_758 = (float)local_e40[8];
        fStack_754 = (float)((ulong)local_e40[8] >> 0x20);
        fStack_750 = (float)local_e40[9];
        fStack_74c = (float)((ulong)local_e40[9] >> 0x20);
        local_7a8 = (float)puVar8[0x28];
        fStack_7a4 = (float)((ulong)puVar8[0x28] >> 0x20);
        fStack_7a0 = (float)puVar8[0x29];
        fStack_79c = (float)((ulong)puVar8[0x29] >> 0x20);
        local_7b8 = (float)*local_e48;
        fStack_7b4 = (float)((ulong)*local_e48 >> 0x20);
        fStack_7b0 = (float)local_e48[1];
        fStack_7ac = (float)((ulong)local_e48[1] >> 0x20);
        local_808 = (float)puVar8[0x2a];
        fStack_804 = (float)((ulong)puVar8[0x2a] >> 0x20);
        fStack_800 = (float)puVar8[0x2b];
        fStack_7fc = (float)((ulong)puVar8[0x2b] >> 0x20);
        local_818 = (float)local_e48[2];
        fStack_814 = (float)((ulong)local_e48[2] >> 0x20);
        fStack_810 = (float)local_e48[3];
        fStack_80c = (float)((ulong)local_e48[3] >> 0x20);
        local_868 = (float)puVar8[0x2c];
        fStack_864 = (float)((ulong)puVar8[0x2c] >> 0x20);
        fStack_860 = (float)puVar8[0x2d];
        fStack_85c = (float)((ulong)puVar8[0x2d] >> 0x20);
        local_878 = (float)local_e48[4];
        fStack_874 = (float)((ulong)local_e48[4] >> 0x20);
        fStack_870 = (float)local_e48[5];
        fStack_86c = (float)((ulong)local_e48[5] >> 0x20);
        local_8c8 = (float)puVar8[0x2e];
        fStack_8c4 = (float)((ulong)puVar8[0x2e] >> 0x20);
        fStack_8c0 = (float)puVar8[0x2f];
        fStack_8bc = (float)((ulong)puVar8[0x2f] >> 0x20);
        local_8d8 = (float)local_e48[6];
        fStack_8d4 = (float)((ulong)local_e48[6] >> 0x20);
        fStack_8d0 = (float)local_e48[7];
        fStack_8cc = (float)((ulong)local_e48[7] >> 0x20);
        local_928 = (float)puVar8[0x30];
        fStack_924 = (float)((ulong)puVar8[0x30] >> 0x20);
        fStack_920 = (float)puVar8[0x31];
        fStack_91c = (float)((ulong)puVar8[0x31] >> 0x20);
        local_938 = (float)local_e48[8];
        fStack_934 = (float)((ulong)local_e48[8] >> 0x20);
        fStack_930 = (float)local_e48[9];
        fStack_92c = (float)((ulong)local_e48[9] >> 0x20);
        *local_dd8 = CONCAT44(fStack_924 * fStack_934 +
                              fStack_8c4 * fStack_8d4 +
                              fStack_864 * fStack_874 +
                              fStack_804 * fStack_814 +
                              fStack_7a4 * fStack_7b4 +
                              fStack_744 * fStack_754 +
                              fStack_6e4 * fStack_6f4 +
                              fStack_684 * fStack_694 +
                              fStack_624 * fStack_634 +
                              fStack_5c4 * fStack_5d4 +
                              fStack_564 * fStack_574 +
                              fStack_504 * fStack_514 +
                              fStack_4a4 * fStack_4b4 +
                              fStack_444 * fStack_454 +
                              fStack_3e4 * fStack_3f4 +
                              fStack_384 * fStack_394 +
                              fStack_324 * fStack_334 +
                              fStack_2c4 * fStack_2d4 +
                              fStack_264 * fStack_274 +
                              fStack_204 * fStack_214 +
                              fStack_1a4 * fStack_1b4 +
                              fStack_144 * fStack_154 +
                              fStack_e4 * fStack_f4 +
                              fStack_84 * fStack_94 + fStack_24 * fStack_34 + fStack_54,
                              local_928 * local_938 +
                              local_8c8 * local_8d8 +
                              local_868 * local_878 +
                              local_808 * local_818 +
                              local_7a8 * local_7b8 +
                              local_748 * local_758 +
                              local_6e8 * local_6f8 +
                              local_688 * local_698 +
                              local_628 * local_638 +
                              local_5c8 * local_5d8 +
                              local_568 * local_578 +
                              local_508 * local_518 +
                              local_4a8 * local_4b8 +
                              local_448 * local_458 +
                              local_3e8 * local_3f8 +
                              local_388 * local_398 +
                              local_328 * local_338 +
                              local_2c8 * local_2d8 +
                              local_268 * local_278 +
                              local_208 * local_218 +
                              local_1a8 * local_1b8 +
                              local_148 * local_158 +
                              local_e8 * local_f8 +
                              local_88 * local_98 + local_28 * local_38 + local_58);
        local_dd8[1] = CONCAT44(fStack_91c * fStack_92c +
                                fStack_8bc * fStack_8cc +
                                fStack_85c * fStack_86c +
                                fStack_7fc * fStack_80c +
                                fStack_79c * fStack_7ac +
                                fStack_73c * fStack_74c +
                                fStack_6dc * fStack_6ec +
                                fStack_67c * fStack_68c +
                                fStack_61c * fStack_62c +
                                fStack_5bc * fStack_5cc +
                                fStack_55c * fStack_56c +
                                fStack_4fc * fStack_50c +
                                fStack_49c * fStack_4ac +
                                fStack_43c * fStack_44c +
                                fStack_3dc * fStack_3ec +
                                fStack_37c * fStack_38c +
                                fStack_31c * fStack_32c +
                                fStack_2bc * fStack_2cc +
                                fStack_25c * fStack_26c +
                                fStack_1fc * fStack_20c +
                                fStack_19c * fStack_1ac +
                                fStack_13c * fStack_14c +
                                fStack_dc * fStack_ec +
                                fStack_7c * fStack_8c + fStack_1c * fStack_2c + fStack_4c,
                                fStack_920 * fStack_930 +
                                fStack_8c0 * fStack_8d0 +
                                fStack_860 * fStack_870 +
                                fStack_800 * fStack_810 +
                                fStack_7a0 * fStack_7b0 +
                                fStack_740 * fStack_750 +
                                fStack_6e0 * fStack_6f0 +
                                fStack_680 * fStack_690 +
                                fStack_620 * fStack_630 +
                                fStack_5c0 * fStack_5d0 +
                                fStack_560 * fStack_570 +
                                fStack_500 * fStack_510 +
                                fStack_4a0 * fStack_4b0 +
                                fStack_440 * fStack_450 +
                                fStack_3e0 * fStack_3f0 +
                                fStack_380 * fStack_390 +
                                fStack_320 * fStack_330 +
                                fStack_2c0 * fStack_2d0 +
                                fStack_260 * fStack_270 +
                                fStack_200 * fStack_210 +
                                fStack_1a0 * fStack_1b0 +
                                fStack_140 * fStack_150 +
                                fStack_e0 * fStack_f0 +
                                fStack_80 * fStack_90 + fStack_20 * fStack_30 + fStack_50);
        local_dd8 = local_dd8 + 2;
        local_e28 = local_e28 + 4;
        local_e30 = local_e30 + 4;
        local_e38 = local_e38 + 4;
        local_e40 = local_e40 + 4;
        local_e48 = local_e48 + 4;
      }
      local_e28 = (undefined8 *)((long)local_e28 + (long)iVar7 * 4);
      local_e30 = (undefined8 *)((long)local_e30 + (long)iVar7 * 4);
      local_e38 = (undefined8 *)((long)local_e38 + (long)iVar7 * 4);
      local_e40 = (undefined8 *)((long)local_e40 + (long)iVar7 * 4);
      local_e48 = (undefined8 *)((long)local_e48 + (long)iVar7 * 4);
    }
  }
  return;
}

Assistant:

static void convdw5x5s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps(bias + g * 4) : _mm_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out;

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm_store_ps(outptr0, _sum0);

                outptr0 += 4;

                r0 += 4 * 2;
                r1 += 4 * 2;
                r2 += 4 * 2;
                r3 += 4 * 2;
                r4 += 4 * 2;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}